

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

bool __thiscall QTreeView::viewportEvent(QTreeView *this,QEvent *event)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  QTreeViewPrivate *pQVar6;
  QWidget *rect;
  QEvent *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar7;
  int oldBranch;
  QHoverEvent *he;
  QTreeViewPrivate *d;
  QModelIndex newIndex;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QAbstractScrollArea *in_stack_ffffffffffffff60;
  QTreeViewPrivate *this_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  RectRule rule;
  QPoint in_stack_ffffffffffffffc0;
  QAbstractItemView *in_stack_ffffffffffffffc8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QTreeView *)0x8f4455);
  TVar4 = QEvent::type(in_RSI);
  if (TVar4 - HoverEnter < 3) {
    iVar1 = pQVar6->hoverBranch;
    this_00 = pQVar6;
    QSinglePointEvent::position((QSinglePointEvent *)0x8f449f);
    QPointF::toPoint(in_RDI);
    iVar5 = QTreeViewPrivate::itemDecorationAt
                      (in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._0_8_);
    rule = in_stack_ffffffffffffffa0._12_4_;
    pQVar6->hoverBranch = iVar5;
    in_stack_ffffffffffffffc8 = (QAbstractItemView *)&DAT_aaaaaaaaaaaaaaaa;
    QVar7 = QSinglePointEvent::position((QSinglePointEvent *)0x8f4516);
    in_stack_ffffffffffffffc0 = QPointF::toPoint(in_RDI);
    (**(code **)((long)in_RDI->xp + 0x1f0))
              (&stack0xffffffffffffffc8,in_RDI,&stack0xffffffffffffffc0);
    bVar3 = ::operator!=((QPersistentModelIndex *)in_stack_ffffffffffffff60,
                         (QModelIndex *)
                         CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if ((bVar3) || (pQVar6->hoverBranch != iVar1)) {
      rect = QAbstractScrollArea::viewport(in_stack_ffffffffffffff60);
      QTreeViewPrivate::visualRect((QTreeViewPrivate *)QVar7.yp,(QModelIndex *)QVar7.xp,rule);
      QWidget::update((QWidget *)this_00,(QRect *)rect);
    }
  }
  bVar3 = QAbstractItemView::viewportEvent
                    (in_stack_ffffffffffffffc8,(QEvent *)in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QTreeView::viewportEvent(QEvent *event)
{
    Q_D(QTreeView);
    switch (event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove: {
        QHoverEvent *he = static_cast<QHoverEvent*>(event);
        const int oldBranch = d->hoverBranch;
        d->hoverBranch = d->itemDecorationAt(he->position().toPoint());
        QModelIndex newIndex = indexAt(he->position().toPoint());
        if (d->hover != newIndex || d->hoverBranch != oldBranch) {
            // Update the whole hovered over row. No need to update the old hovered
            // row, that is taken care in superclass hover handling.
            viewport()->update(d->visualRect(newIndex, QTreeViewPrivate::FullRow));
        }
        break; }
    default:
        break;
    }
    return QAbstractItemView::viewportEvent(event);
}